

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifSat.c
# Opt level: O3

int If_ManSatCheckXY(void *pSat,int nLutSize,word *pTruth,int nVars,uint uSet,word *pTBound,
                    word *pTFree,Vec_Int_t *vLits)

{
  word *pTruth_00;
  byte bVar1;
  int *piVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  word uFree;
  uint uVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  int nBSet;
  int nFSet;
  int nSSet;
  sat_solver *local_128;
  uint local_11c;
  word *local_118;
  uint local_10c;
  word *local_108;
  word Res;
  int pFSet [15];
  int pSSet [15];
  int pBSet [15];
  
  nBSet = 0;
  nSSet = 0;
  nFSet = 0;
  bVar3 = (byte)nLutSize;
  local_10c = 1 << (bVar3 & 0x1f);
  local_11c = nLutSize * 2 - 1;
  uVar13 = 1 << ((byte)local_11c & 0x1f);
  local_128 = (sat_solver *)pSat;
  local_118 = pTruth;
  local_108 = pTBound;
  Dau_DecSortSet(uSet,nVars,&nBSet,&nSSet,&nFSet);
  if (nBSet + nSSet + nFSet != nVars) {
    __assert_fail("nBSet + nSSet + nFSet == nVars",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifSat.c"
                  ,0xa3,
                  "int If_ManSatCheckXY(void *, int, word *, int, unsigned int, word *, word *, Vec_Int_t *)"
                 );
  }
  if (nLutSize < nBSet + nSSet) {
    __assert_fail("nSSet + nBSet <= nLutSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifSat.c"
                  ,0xa5,
                  "int If_ManSatCheckXY(void *, int, word *, int, unsigned int, word *, word *, Vec_Int_t *)"
                 );
  }
  if (nLutSize * 2 <= nSSet + nLutSize + nFSet) {
    __assert_fail("nLutSize + nSSet + nFSet <= 2*nLutSize - 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifSat.c"
                  ,0xa6,
                  "int If_ManSatCheckXY(void *, int, word *, int, unsigned int, word *, word *, Vec_Int_t *)"
                 );
  }
  if (vLits->nCap < (int)uVar13) {
    if (vLits->pArray == (int *)0x0) {
      piVar2 = (int *)malloc((long)(int)uVar13 << 2);
    }
    else {
      piVar2 = (int *)realloc(vLits->pArray,(long)(int)uVar13 << 2);
    }
    vLits->pArray = piVar2;
    if (piVar2 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    vLits->nCap = uVar13;
  }
  if (local_11c != 0x1f) {
    memset(vLits->pArray,0xff,(ulong)uVar13 << 2);
  }
  vLits->nSize = uVar13;
  if (nVars != 0x1f) {
    local_11c = 1 << ((byte)nVars & 0x1f);
    uVar9 = 0;
    do {
      uVar13 = (uint)uVar9;
      if (0 < nVars) {
        iVar5 = 0;
        uVar15 = 0;
        iVar12 = 0;
        uVar14 = 0;
        uVar10 = 0;
        bVar1 = 0;
        uVar11 = 0;
        iVar4 = 0;
        switch(uSet & 3) {
        case 1:
          goto switchD_00434524_caseD_1;
        case 2:
switchD_00434524_caseD_2:
          __assert_fail("Value == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifSat.c"
                        ,0xc6,
                        "int If_ManSatCheckXY(void *, int, word *, int, unsigned int, word *, word *, Vec_Int_t *)"
                       );
        case 3:
          goto switchD_00434524_caseD_3;
        }
switchD_00434524_caseD_0:
        iVar12 = iVar4;
        uVar15 = uVar11;
        if ((uVar13 >> (uVar14 & 0x1f) & 1) != 0) {
          uVar10 = uVar10 | 1 << (iVar5 + nLutSize + nSSet & 0x1fU);
          pFSet[iVar5] = uVar14;
        }
        iVar5 = iVar5 + 1;
        do {
          uVar14 = uVar14 + 1;
          if (nVars == uVar14) {
            if ((iVar12 != nBSet) || (iVar5 != nFSet)) goto LAB_00434a76;
            if (-1 < (int)uVar10) goto LAB_004345e3;
            goto LAB_00434a38;
          }
          bVar1 = bVar1 + 2;
          uVar11 = uVar15;
          iVar4 = iVar12;
          switch(uSet >> (bVar1 & 0x1f) & 3) {
          case 0:
            goto switchD_00434524_caseD_0;
          case 1:
switchD_00434524_caseD_1:
            uVar15 = uVar11;
            if ((uVar13 >> (uVar14 & 0x1f) & 1) != 0) {
              uVar10 = uVar10 | 1 << (nSSet + iVar12 & 0x1fU);
              pBSet[iVar12] = uVar14;
            }
            iVar12 = iVar12 + 1;
            break;
          case 2:
            goto switchD_00434524_caseD_2;
          case 3:
switchD_00434524_caseD_3:
            iVar12 = iVar4;
            if ((uVar13 >> (uVar14 & 0x1f) & 1) != 0) {
              uVar10 = uVar10 | 1 << ((char)uVar15 + bVar3 & 0x1f) | 1 << (uVar15 & 0x1f);
              pSSet[(int)uVar15] = uVar14;
            }
            uVar15 = uVar15 + 1;
          }
        } while( true );
      }
      uVar10 = 0;
      if (nFSet != 0 || nBSet != 0) {
LAB_00434a76:
        __assert_fail("iBSet == nBSet && iFSet == nFSet",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifSat.c"
                      ,200,
                      "int If_ManSatCheckXY(void *, int, word *, int, unsigned int, word *, word *, Vec_Int_t *)"
                     );
      }
LAB_004345e3:
      if (vLits->nSize <= (int)uVar10) {
LAB_00434a38:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      if (vLits->pArray[uVar10] != -1) {
        __assert_fail("Vec_IntEntry(vLits, mNew) == -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifSat.c"
                      ,0xc9,
                      "int If_ManSatCheckXY(void *, int, word *, int, unsigned int, word *, word *, Vec_Int_t *)"
                     );
      }
      vLits->pArray[uVar10] = (uint)((local_118[uVar9 >> 6] >> (uVar9 & 0x3f) & 1) != 0);
      uVar9 = (ulong)(uVar13 + 1);
    } while (uVar13 + 1 != local_11c);
    uVar13 = vLits->nSize;
  }
  if ((int)uVar13 < 1) {
    uVar11 = 0;
  }
  else {
    piVar2 = vLits->pArray;
    iVar5 = 2 << (bVar3 & 0x1f);
    iVar4 = iVar5 * 2;
    lVar8 = 0;
    uVar11 = 0;
    do {
      iVar12 = piVar2[lVar8];
      if (-1 < iVar12) {
        if (iVar5 + (int)lVar8 < 0) {
          __assert_fail("Var >= 0 && !(c >> 1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x12e,"int Abc_Var2Lit(int, int)");
        }
        if (((int)uVar11 < 0) || (uVar13 <= uVar11)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        uVar9 = (ulong)uVar11;
        uVar11 = uVar11 + 1;
        piVar2[uVar9] = iVar4 + (uint)(iVar12 == 0);
        uVar13 = vLits->nSize;
      }
      lVar8 = lVar8 + 1;
      iVar4 = iVar4 + 2;
    } while (lVar8 < (int)uVar13);
  }
  if ((int)uVar13 < (int)uVar11) {
    __assert_fail("p->nSize >= nSizeNew",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x2b7,"void Vec_IntShrink(Vec_Int_t *, int)");
  }
  vLits->nSize = uVar11;
  iVar5 = 0;
  iVar4 = sat_solver_solve(local_128,vLits->pArray,vLits->pArray + (int)uVar11,0,0,0,0);
  pTruth_00 = local_108;
  if ((iVar4 != 1) || (iVar5 = 1, pTFree == (word *)0x0 || local_108 == (word *)0x0)) {
    return iVar5;
  }
  uVar13 = nBSet + nSSet;
  if (nLutSize < (int)uVar13) {
    __assert_fail("nSSet + nBSet <= nLutSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifSat.c"
                  ,0xdd,
                  "int If_ManSatCheckXY(void *, int, word *, int, unsigned int, word *, word *, Vec_Int_t *)"
                 );
  }
  *local_108 = 0;
  uVar9 = 0;
  if (uVar13 != 0x1f) {
    uVar6 = (ulong)(uint)local_128->size;
    if (local_128->size < 1) {
      uVar6 = uVar9;
    }
    do {
      if (uVar6 == uVar9) goto LAB_00434ad3;
      if (local_128->model[uVar9] == 1) {
        local_108[uVar9 >> 6 & 0x3ffffff] =
             local_108[uVar9 >> 6 & 0x3ffffff] | 1L << ((byte)uVar9 & 0x3f);
      }
      uVar9 = uVar9 + 1;
    } while ((uint)(1 << ((byte)uVar13 & 0x1f)) != uVar9);
    if ((int)uVar13 < 0) goto LAB_00434bea;
    uVar9 = *local_108;
  }
  uVar11 = 2;
  if (2 < uVar13) {
    uVar11 = uVar13;
  }
  uVar10 = 3;
  if (2 < uVar13) {
    uVar10 = uVar11;
  }
  uVar11 = 4;
  if (uVar10 != 3) {
    uVar11 = uVar10;
  }
  uVar14 = 5;
  if (uVar11 != 4) {
    uVar14 = uVar11;
  }
  if (uVar14 - 5 < 2) {
    uVar7 = (uint)uVar9;
    uVar15 = -(uVar7 & 1);
    if (uVar13 != 0) {
      uVar15 = uVar7;
    }
    uVar15 = (uVar15 & 3) * 5;
    if (1 < uVar13) {
      uVar15 = uVar7;
    }
    uVar6 = (ulong)((uVar15 & 0xf) << 4 | uVar15 & 0xf);
    if (2 < uVar13) {
      uVar6 = uVar9;
    }
    uVar9 = (ulong)(uint)((int)(uVar6 & 0xff) << 8) | uVar6 & 0xff;
    if (uVar10 != 3) {
      uVar9 = uVar6;
    }
    uVar6 = (ulong)(uint)((int)uVar9 << 0x10) | uVar9 & 0xffff;
    if (uVar11 != 4) {
      uVar6 = uVar9;
    }
    uVar9 = uVar6 << 0x20 | uVar6 & 0xffffffff;
    if (uVar14 != 5) {
      uVar9 = uVar6;
    }
    *local_108 = uVar9;
    if (nLutSize <= nFSet + nSSet) {
      __assert_fail("nSSet + nFSet + 1 <= nLutSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifSat.c"
                    ,0xe5,
                    "int If_ManSatCheckXY(void *, int, word *, int, unsigned int, word *, word *, Vec_Int_t *)"
                   );
    }
    *pTFree = 0;
    uVar13 = nSSet + nFSet + 1;
    if (uVar13 == 0x1f) {
      uVar9 = 0;
    }
    else {
      uVar9 = 0;
      do {
        if ((nLutSize == 0x1f) || (local_128->size <= (int)(local_10c + (int)uVar9))) {
LAB_00434ad3:
          __assert_fail("v >= 0 && v < s->size",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.h"
                        ,0xda,"int sat_solver_var_value(sat_solver *, int)");
        }
        if (local_128->model[local_10c + uVar9] == 1) {
          pTFree[uVar9 >> 6 & 0x3ffffff] =
               pTFree[uVar9 >> 6 & 0x3ffffff] | 1L << ((byte)uVar9 & 0x3f);
        }
        uVar9 = uVar9 + 1;
      } while ((uint)(1 << ((byte)uVar13 & 0x1f)) != uVar9);
      if ((int)uVar13 < 0) {
LAB_00434bea:
        __assert_fail("nVars >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                      ,0x489,"word Abc_Tt6Stretch(word, int)");
      }
      uVar9 = *pTFree;
    }
    uVar11 = 2;
    if (2 < uVar13) {
      uVar11 = uVar13;
    }
    uVar10 = 3;
    if (2 < uVar13) {
      uVar10 = uVar11;
    }
    uVar11 = 4;
    if (uVar10 != 3) {
      uVar11 = uVar10;
    }
    uVar14 = 5;
    if (uVar11 != 4) {
      uVar14 = uVar11;
    }
    if (uVar14 - 5 < 2) {
      uVar7 = (uint)uVar9;
      uVar15 = -(uVar7 & 1);
      if (uVar13 != 0) {
        uVar15 = uVar7;
      }
      uVar15 = (uVar15 & 3) * 5;
      if (1 < uVar13) {
        uVar15 = uVar7;
      }
      uVar6 = (ulong)((uVar15 & 0xf) << 4 | uVar15 & 0xf);
      if (2 < uVar13) {
        uVar6 = uVar9;
      }
      uVar9 = (ulong)(uint)((int)(uVar6 & 0xff) << 8) | uVar6 & 0xff;
      if (uVar10 != 3) {
        uVar9 = uVar6;
      }
      uVar6 = (ulong)(uint)((int)uVar9 << 0x10) | uVar9 & 0xffff;
      if (uVar11 != 4) {
        uVar6 = uVar9;
      }
      uFree = (uVar6 & 0xffffffff) * 0x100000001;
      if (uVar14 != 5) {
        uFree = uVar6;
      }
      *pTFree = uFree;
      if (nLutSize != 4 || nVars != 6) {
        return 1;
      }
      Res = If_ManSat6Truth(*local_108,uFree,pBSet,nBSet,pSSet,nSSet,pFSet,nFSet);
      if (*local_118 == Res) {
        return 1;
      }
      Dau_DsdPrintFromTruth(local_118,6);
      Dau_DsdPrintFromTruth(&Res,6);
      Dau_DsdPrintFromTruth(pTruth_00,nBSet + nSSet);
      Dau_DsdPrintFromTruth(pTFree,nSSet + nFSet + 1);
      puts("Verification failed!");
      return 1;
    }
  }
  __assert_fail("nVars == 6",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                ,0x496,"word Abc_Tt6Stretch(word, int)");
}

Assistant:

int If_ManSatCheckXY( void * pSat, int nLutSize, word * pTruth, int nVars, unsigned uSet, word * pTBound, word * pTFree, Vec_Int_t * vLits )
{
    sat_solver * p = (sat_solver *)pSat;
    int iBSet, nBSet = 0, pBSet[IF_MAX_FUNC_LUTSIZE];
    int iSSet, nSSet = 0, pSSet[IF_MAX_FUNC_LUTSIZE];
    int iFSet, nFSet = 0, pFSet[IF_MAX_FUNC_LUTSIZE];
    int nMintsL = (1 << nLutSize);
    int nMintsF = (1 << (2 * nLutSize - 1));
    int v, Value, m, mNew, nMintsFNew, nMintsLNew;
    word Res;
    // collect variable sets
    Dau_DecSortSet( uSet, nVars, &nBSet, &nSSet, &nFSet );
    assert( nBSet + nSSet + nFSet == nVars );
    // check variable bounds
    assert( nSSet + nBSet <= nLutSize );
    assert( nLutSize + nSSet + nFSet <= 2*nLutSize - 1 );
    nMintsFNew = (1 << (nLutSize + nSSet + nFSet));
    // remap minterms
    Vec_IntFill( vLits, nMintsF, -1 );
    for ( m = 0; m < (1 << nVars); m++ )
    {
        mNew = iBSet = iSSet = iFSet = 0;
        for ( v = 0; v < nVars; v++ )
        {
            Value = ((uSet >> (v << 1)) & 3);
            if ( Value == 0 ) // FS
            {
                if ( ((m >> v) & 1) )
                    mNew |= 1 << (nLutSize + nSSet + iFSet), pFSet[iFSet] = v;
                iFSet++;
            }
            else if ( Value == 1 ) // BS
            {
                if ( ((m >> v) & 1) )
                    mNew |= 1 << (nSSet + iBSet), pBSet[iBSet] = v;
                iBSet++;
            }
            else if ( Value == 3 ) // SS
            {
                if ( ((m >> v) & 1) )
                {
                    mNew |= 1 << iSSet;
                    mNew |= 1 << (nLutSize + iSSet);
                    pSSet[iSSet] = v;
                }
                iSSet++;
            }
            else assert( Value == 0 );
        }
        assert( iBSet == nBSet && iFSet == nFSet );
        assert( Vec_IntEntry(vLits, mNew) == -1 );
        Vec_IntWriteEntry( vLits, mNew, Abc_TtGetBit(pTruth, m) );
    }
    // find assumptions
    v = 0;
    Vec_IntForEachEntry( vLits, Value, m )
    {
//        printf( "%d", (Value >= 0) ? Value : 2 );
        if ( Value >= 0 )
            Vec_IntWriteEntry( vLits, v++, Abc_Var2Lit(2 * nMintsL + m, !Value) );
    }
    Vec_IntShrink( vLits, v );
//    printf( " %d\n", Vec_IntSize(vLits) );
    // run SAT solver
    Value = sat_solver_solve( p, Vec_IntArray(vLits), Vec_IntArray(vLits) + Vec_IntSize(vLits), 0, 0, 0, 0 );
    if ( Value != l_True )
        return 0;
    if ( pTBound && pTFree )
    {
        // collect config
        assert( nSSet + nBSet <= nLutSize );
        *pTBound = 0;
        nMintsLNew = (1 << (nSSet + nBSet));
        for ( m = 0; m < nMintsLNew; m++ )
            if ( sat_solver_var_value(p, m) )
                Abc_TtSetBit( pTBound, m );
        *pTBound = Abc_Tt6Stretch( *pTBound, nSSet + nBSet );
        // collect configs
        assert( nSSet + nFSet + 1 <= nLutSize );
        *pTFree = 0;
        nMintsLNew = (1 << (1 + nSSet + nFSet));
        for ( m = 0; m < nMintsLNew; m++ )
            if ( sat_solver_var_value(p, nMintsL+m) )
                Abc_TtSetBit( pTFree, m );
        *pTFree = Abc_Tt6Stretch( *pTFree, 1 + nSSet + nFSet );
        if ( nVars != 6 || nLutSize != 4 )
            return 1;
        // verify the result
        Res = If_ManSat6Truth( *pTBound, *pTFree, pBSet, nBSet, pSSet, nSSet, pFSet, nFSet );
        if ( pTruth[0] != Res )
        {
            Dau_DsdPrintFromTruth( pTruth,  nVars );
            Dau_DsdPrintFromTruth( &Res,    nVars );
            Dau_DsdPrintFromTruth( pTBound, nSSet+nBSet );
            Dau_DsdPrintFromTruth( pTFree,  nSSet+nFSet+1 );
            printf( "Verification failed!\n" );
        }
    }
    return 1;
}